

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PinHole.cpp
# Opt level: O0

Vector3 __thiscall pm::PinHole::rayDirection(PinHole *this,float x,float y)

{
  long in_RSI;
  undefined8 extraout_XMM0_Qa;
  Vector3 VVar2;
  pm local_50 [12];
  pm local_44 [12];
  Vector3 local_38;
  Vector3 local_2c;
  float local_20;
  float local_1c;
  float y_local;
  float x_local;
  PinHole *this_local;
  Vector3 *dir;
  float fVar1;
  
  local_20 = y;
  local_1c = x;
  this_local = this;
  operator*((pm *)&local_38,x,(Vector3 *)(in_RSI + 0x30));
  operator*(local_44,local_20,(Vector3 *)(in_RSI + 0x3c));
  Vector3::operator+(&local_2c,&local_38);
  operator*(local_50,*(float *)(in_RSI + 0x58),(Vector3 *)(in_RSI + 0x48));
  VVar2 = Vector3::operator-((Vector3 *)this,&local_2c);
  fVar1 = VVar2.z;
  Vector3::normalize((Vector3 *)this);
  VVar2.z = fVar1;
  VVar2.x = (float)(int)extraout_XMM0_Qa;
  VVar2.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar2;
}

Assistant:

Vector3 PinHole::rayDirection(float x, float y) const
{
	Vector3 dir = x * u_ + y * v_ - distance_ * w_;
	dir.normalize();

	return dir;
}